

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureViewTests.cpp
# Opt level: O0

void __thiscall
gl4cts::TextureViewTestViewSampling::initParentTextureContents(TextureViewTestViewSampling *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  GLenum GVar4;
  code *pcVar5;
  undefined1 auVar6 [16];
  int iVar7;
  deUint32 dVar8;
  RenderContext *pRVar9;
  undefined4 extraout_var;
  TestError *this_00;
  float *pfVar11;
  ulong uVar12;
  void *pvVar13;
  float local_10c;
  uint local_d8;
  bool local_d1;
  bool local_c1;
  uint layer_id;
  undefined1 local_ac [8];
  Vec4 reference_color_1;
  uint n_sample;
  uint n_samples;
  uint n_mipmap_1;
  uint n_face;
  uint n_layer_1;
  float *reference_colors;
  uint n_faces;
  undefined1 local_6c [8];
  Vec4 reference_color;
  undefined1 local_4c [8];
  uint n_mipmap;
  uint n_mipmaps_for_layer;
  uint n_layer;
  GLenum texture_target;
  uint n_texture_target;
  GLenum texture_targets [6];
  uint n_texture_targets;
  bool is_multisampled_texture_target;
  bool is_arrayed_texture_target;
  Functions *gl;
  TextureViewTestViewSampling *this_local;
  long lVar10;
  
  pRVar9 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar7 = (*pRVar9->_vptr_RenderContext[3])();
  lVar10 = CONCAT44(extraout_var,iVar7);
  (**(code **)(lVar10 + 0xb8))(this->m_iteration_parent_texture_target,this->m_to_id);
  dVar8 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar8,"glBindTexture() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x1579);
  local_c1 = true;
  if ((this->m_iteration_parent_texture_target != 0x8c18) &&
     (local_c1 = true, this->m_iteration_parent_texture_target != 0x8c1a)) {
    local_c1 = this->m_iteration_parent_texture_target == 0x9009;
  }
  texture_targets[5]._3_1_ = local_c1;
  local_d1 = true;
  if (this->m_iteration_parent_texture_target != 0x9100) {
    local_d1 = this->m_iteration_parent_texture_target == 0x9102;
  }
  texture_targets[5]._2_1_ = local_d1;
  if ((local_c1 == false) && (local_d1 == false)) {
    texture_targets[4] = 1;
    memset(&texture_target,0,0x18);
    texture_target = this->m_iteration_parent_texture_target;
    if (this->m_iteration_parent_texture_target == 0x8513) {
      texture_target = 0x8515;
      n_texture_target = 0x8516;
      texture_targets[0] = 0x8517;
      texture_targets[1] = 0x8518;
      texture_targets[2] = 0x8519;
      texture_targets[3] = 0x851a;
      texture_targets[4] = 6;
    }
    resetReferenceColorStorage
              (this,this->m_iteration_parent_texture_depth,texture_targets[4],
               this->m_iteration_parent_texture_n_levels,1);
    for (n_layer = 0; n_layer < texture_targets[4]; n_layer = n_layer + 1) {
      GVar4 = (&texture_target)[n_layer];
      for (n_mipmap = 0; n_mipmap < this->m_iteration_parent_texture_depth; n_mipmap = n_mipmap + 1)
      {
        if (GVar4 == 0x806f) {
          local_d8 = this->m_iteration_parent_texture_n_levels - n_mipmap;
        }
        else {
          local_d8 = this->m_iteration_parent_texture_n_levels;
        }
        for (local_4c._0_4_ = 0; (uint)local_4c._0_4_ < local_d8;
            local_4c._0_4_ = local_4c._0_4_ + 1) {
          if (GVar4 == 0xde0) {
            (**(code **)(lVar10 + 0x698))(0x8ca9,0x8ce0,0xde0,this->m_to_id);
            dVar8 = (**(code **)(lVar10 + 0x800))();
            glu::checkError(dVar8,"glFramebufferTexture1D() call failed.",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                            ,0x15bb);
          }
          else {
            if (GVar4 != 0xde1) {
              if (GVar4 == 0x806f) {
                (**(code **)(lVar10 + 0x6a8))
                          (0x8ca9,0x8ce0,0x806f,this->m_to_id,local_4c._0_4_,n_mipmap);
                dVar8 = (**(code **)(lVar10 + 0x800))();
                glu::checkError(dVar8,"glFramebufferTexture3D() call failed.",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                                ,0x15d4);
                goto LAB_01145a63;
              }
              if ((GVar4 != 0x84f5) && (5 < GVar4 - 0x8515)) {
                this_00 = (TestError *)__cxa_allocate_exception(0x38);
                tcu::TestError::TestError
                          (this_00,"Unrecognized texture target",(char *)0x0,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                           ,0x15da);
                __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
              }
            }
            (**(code **)(lVar10 + 0x6a0))(0x8ca9,0x8ce0,GVar4,this->m_to_id);
            dVar8 = (**(code **)(lVar10 + 0x800))();
            glu::checkError(dVar8,"glFramebufferTexture2D() call failed.",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                            ,0x15cb);
          }
LAB_01145a63:
          getRandomReferenceColor((TextureViewTestViewSampling *)local_6c);
          tcu::Vector<float,_4>::Vector
                    ((Vector<float,_4> *)((long)&reference_colors + 4),(Vector<float,_4> *)local_6c)
          ;
          setReferenceColor(this,n_mipmap,n_layer,local_4c._0_4_,0,
                            (Vec4 *)((long)&reference_colors + 4));
          pcVar5 = *(code **)(lVar10 + 0x1c0);
          pfVar11 = tcu::Vector<float,_4>::x((Vector<float,_4> *)local_6c);
          fVar1 = *pfVar11;
          pfVar11 = tcu::Vector<float,_4>::y((Vector<float,_4> *)local_6c);
          fVar2 = *pfVar11;
          pfVar11 = tcu::Vector<float,_4>::z((Vector<float,_4> *)local_6c);
          fVar3 = *pfVar11;
          pfVar11 = tcu::Vector<float,_4>::w((Vector<float,_4> *)local_6c);
          (*pcVar5)(fVar1,fVar2,fVar3,*pfVar11);
          dVar8 = (**(code **)(lVar10 + 0x800))();
          glu::checkError(dVar8,"glClearColor() call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                          ,0x15e7);
          (**(code **)(lVar10 + 0x188))(0x4000);
          dVar8 = (**(code **)(lVar10 + 0x800))();
          glu::checkError(dVar8,"glClear() call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                          ,0x15ea);
        }
      }
    }
  }
  else {
    reference_colors._0_4_ = 1;
    if (this->m_iteration_parent_texture_target == 0x9009) {
      reference_colors._0_4_ = 6;
    }
    resetReferenceColorStorage
              (this,this->m_iteration_parent_texture_depth,(uint)reference_colors,
               this->m_iteration_parent_texture_n_levels,this->m_max_color_texture_samples_gl_value)
    ;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = (long)(this->m_max_color_texture_samples_gl_value << 2);
    uVar12 = SUB168(auVar6 * ZEXT816(4),0);
    if (SUB168(auVar6 * ZEXT816(4),8) != 0) {
      uVar12 = 0xffffffffffffffff;
    }
    pvVar13 = operator_new__(uVar12);
    (**(code **)(lVar10 + 0x1680))(this->m_per_sample_filler_po_id);
    dVar8 = (**(code **)(lVar10 + 0x800))();
    glu::checkError(dVar8,"glUseProgram() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x160a);
    for (n_mipmap_1 = 0; n_mipmap_1 < this->m_iteration_parent_texture_depth;
        n_mipmap_1 = n_mipmap_1 + 1) {
      for (n_samples = 0; n_samples < (uint)reference_colors; n_samples = n_samples + 1) {
        for (n_sample = 0; n_sample < this->m_iteration_parent_texture_n_levels;
            n_sample = n_sample + 1) {
          if (this->m_iteration_parent_texture_target == 0x9100) {
            (**(code **)(lVar10 + 0x6a0))
                      (0x8ca9,0x8ce0,this->m_iteration_parent_texture_target,this->m_to_id,n_sample)
            ;
            dVar8 = (**(code **)(lVar10 + 0x800))();
            glu::checkError(dVar8,"glFramebufferTexture2D() call failed.",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                            ,0x1627);
          }
          else {
            (**(code **)(lVar10 + 0x690))(0x8ca9,0x8ce0,this->m_to_id,n_sample);
            dVar8 = (**(code **)(lVar10 + 0x800))();
            glu::checkError(dVar8,"glFramebufferTextureLayer() call failed.",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                            ,0x161d);
          }
          if ((texture_targets[5]._2_1_ & 1) == 0) {
            local_10c = 1.4013e-45;
          }
          else {
            local_10c = (float)this->m_max_color_texture_samples_gl_value;
          }
          reference_color_1.m_data[3] = local_10c;
          for (reference_color_1.m_data[2] = 0.0;
              (uint)reference_color_1.m_data[2] < (uint)reference_color_1.m_data[3];
              reference_color_1.m_data[2] = (float)((int)reference_color_1.m_data[2] + 1)) {
            getRandomReferenceColor((TextureViewTestViewSampling *)local_ac);
            pfVar11 = tcu::Vector<float,_4>::x((Vector<float,_4> *)local_ac);
            *(float *)((long)pvVar13 + (ulong)(uint)((int)reference_color_1.m_data[2] << 2) * 4) =
                 *pfVar11;
            pfVar11 = tcu::Vector<float,_4>::y((Vector<float,_4> *)local_ac);
            *(float *)((long)pvVar13 + (ulong)((int)reference_color_1.m_data[2] * 4 + 1) * 4) =
                 *pfVar11;
            pfVar11 = tcu::Vector<float,_4>::z((Vector<float,_4> *)local_ac);
            *(float *)((long)pvVar13 + (ulong)((int)reference_color_1.m_data[2] * 4 + 2) * 4) =
                 *pfVar11;
            pfVar11 = tcu::Vector<float,_4>::w((Vector<float,_4> *)local_ac);
            fVar1 = reference_color_1.m_data[2];
            *(float *)((long)pvVar13 + (ulong)((int)reference_color_1.m_data[2] * 4 + 3) * 4) =
                 *pfVar11;
            tcu::Vector<float,_4>::Vector
                      ((Vector<float,_4> *)&stack0xffffffffffffff44,(Vector<float,_4> *)local_ac);
            setReferenceColor(this,n_mipmap_1,n_samples,n_sample,(uint)fVar1,
                              (Vec4 *)&stack0xffffffffffffff44);
          }
          (**(code **)(lVar10 + 0x15a8))
                    (this->m_per_sample_filler_po_reference_colors_location,
                     reference_color_1.m_data[3],pvVar13);
          dVar8 = (**(code **)(lVar10 + 0x800))();
          glu::checkError(dVar8,"glUniform4fv() call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                          ,0x163c);
          (**(code **)(lVar10 + 0x14f0))
                    (this->m_per_sample_filler_po_layer_id_location,n_samples * 6 + n_mipmap_1);
          dVar8 = (**(code **)(lVar10 + 0x800))();
          glu::checkError(dVar8,"glUniform1i() call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                          ,0x1642);
          (**(code **)(lVar10 + 0x538))(0,0,1);
          dVar8 = (**(code **)(lVar10 + 0x800))();
          glu::checkError(dVar8,"glDrawArrays() call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                          ,0x1649);
        }
      }
    }
    if (pvVar13 != (void *)0x0) {
      operator_delete__(pvVar13);
    }
  }
  return;
}

Assistant:

void TextureViewTestViewSampling::initParentTextureContents()
{
	static const glw::GLenum cm_texture_targets[] = {
		/* NOTE: This order must match the order used for sampling CM/CMA texture targets. */
		GL_TEXTURE_CUBE_MAP_POSITIVE_X, GL_TEXTURE_CUBE_MAP_NEGATIVE_X, GL_TEXTURE_CUBE_MAP_POSITIVE_Y,
		GL_TEXTURE_CUBE_MAP_NEGATIVE_Y, GL_TEXTURE_CUBE_MAP_POSITIVE_Z, GL_TEXTURE_CUBE_MAP_NEGATIVE_Z
	};
	static const unsigned int n_cm_texture_targets = sizeof(cm_texture_targets) / sizeof(cm_texture_targets[0]);
	const glw::Functions&	 gl				   = m_context.getRenderContext().getFunctions();

	/* Bind the parent texture */
	gl.bindTexture(m_iteration_parent_texture_target, m_to_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture() call failed.");

	/* If we're dealing with a single-sampled texture target, then we can clear the
	 * contents of each layer/face/slice using FBO. This will unfortunately not work
	 * for arrayed textures, layers or layer-faces of which cannot be attached to a draw
	 * framebuffer.
	 * If we need to update contents of a multisampled, potentially arrayed texture,
	 * we'll need to use the filler program.
	 **/
	bool is_arrayed_texture_target = (m_iteration_parent_texture_target == GL_TEXTURE_1D_ARRAY ||
									  m_iteration_parent_texture_target == GL_TEXTURE_2D_ARRAY ||
									  m_iteration_parent_texture_target == GL_TEXTURE_CUBE_MAP_ARRAY);
	bool is_multisampled_texture_target = (m_iteration_parent_texture_target == GL_TEXTURE_2D_MULTISAMPLE ||
										   m_iteration_parent_texture_target == GL_TEXTURE_2D_MULTISAMPLE_ARRAY);

	if (!is_arrayed_texture_target && !is_multisampled_texture_target)
	{
		/* Good, no need to work with samples! */
		DE_ASSERT(m_iteration_parent_texture_depth >= 1);
		DE_ASSERT(m_iteration_parent_texture_n_levels >= 1);

		/* Cube-map texture target cannot be directly used for a glFramebufferTexture2D() call. Instead,
		 * we need to split it into 6 cube-map texture targets. */
		unsigned int n_texture_targets					   = 1;
		glw::GLenum  texture_targets[n_cm_texture_targets] = {
			m_iteration_parent_texture_target, GL_NONE, GL_NONE, GL_NONE, GL_NONE, GL_NONE,
		};

		if (m_iteration_parent_texture_target == GL_TEXTURE_CUBE_MAP)
		{
			DE_STATIC_ASSERT(sizeof(texture_targets) == sizeof(cm_texture_targets));
			memcpy(texture_targets, cm_texture_targets, sizeof(cm_texture_targets));

			n_texture_targets = n_cm_texture_targets;
		}

		resetReferenceColorStorage(m_iteration_parent_texture_depth,	/* n_layers */
								   n_texture_targets,					/* n_faces */
								   m_iteration_parent_texture_n_levels, /* n_mipmaps */
								   1);									/* n_samples */

		/* Iterate through all texture targets we need to update */
		for (unsigned int n_texture_target = 0; n_texture_target < n_texture_targets; ++n_texture_target)
		{
			const glw::GLenum texture_target = texture_targets[n_texture_target];

			/* Iterate through all layers of the texture. */
			for (unsigned int n_layer = 0; n_layer < m_iteration_parent_texture_depth; ++n_layer)
			{
				/* ..and mip-maps, too. */
				const unsigned int n_mipmaps_for_layer = (texture_target == GL_TEXTURE_3D) ?
															 (m_iteration_parent_texture_n_levels - n_layer) :
															 (m_iteration_parent_texture_n_levels);

				for (unsigned int n_mipmap = 0; n_mipmap < n_mipmaps_for_layer; ++n_mipmap)
				{
					/* Use appropriate glFramebufferTexture*() API, depending on the texture target of the
					 * parent texture.
					 */
					switch (texture_target)
					{
					case GL_TEXTURE_1D:
					{
						gl.framebufferTexture1D(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_1D, m_to_id,
												n_mipmap);

						GLU_EXPECT_NO_ERROR(gl.getError(), "glFramebufferTexture1D() call failed.");
						break;
					}

					case GL_TEXTURE_2D:
					case GL_TEXTURE_CUBE_MAP_NEGATIVE_X:
					case GL_TEXTURE_CUBE_MAP_NEGATIVE_Y:
					case GL_TEXTURE_CUBE_MAP_NEGATIVE_Z:
					case GL_TEXTURE_CUBE_MAP_POSITIVE_X:
					case GL_TEXTURE_CUBE_MAP_POSITIVE_Y:
					case GL_TEXTURE_CUBE_MAP_POSITIVE_Z:
					case GL_TEXTURE_RECTANGLE:
					{
						gl.framebufferTexture2D(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, texture_target, m_to_id,
												n_mipmap);

						GLU_EXPECT_NO_ERROR(gl.getError(), "glFramebufferTexture2D() call failed.");
						break;
					}

					case GL_TEXTURE_3D:
					{
						gl.framebufferTexture3D(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_3D, m_to_id,
												n_mipmap, n_layer);

						GLU_EXPECT_NO_ERROR(gl.getError(), "glFramebufferTexture3D() call failed.");
						break;
					}

					default:
					{
						TCU_FAIL("Unrecognized texture target");
					}
					} /* switch (m_iteration_parent_texture_target) */

					/* Each layer/mipmap needs to be assigned an unique vec4. */
					tcu::Vec4 reference_color = getRandomReferenceColor();

					setReferenceColor(n_layer, n_texture_target, /* n_face */
									  n_mipmap, 0,				 /* n_sample */
									  reference_color);

					/* We should be OK to clear the mip-map at this point */
					gl.clearColor(reference_color.x(), reference_color.y(), reference_color.z(), reference_color.w());
					GLU_EXPECT_NO_ERROR(gl.getError(), "glClearColor() call failed.");

					gl.clear(GL_COLOR_BUFFER_BIT);
					GLU_EXPECT_NO_ERROR(gl.getError(), "glClear() call failed.");
				} /* for (all mip-maps) */
			}	 /* for (all layers) */
		}		  /* for (all texture targets) */
	}			  /* if (!is_arrayed_texture_target && !is_multisampled_texture_target) */
	else
	{
		/* We need to handle an either multisampled or arrayed texture target or
		 * a combination of the two.
		 */
		DE_ASSERT(m_iteration_parent_texture_target == GL_TEXTURE_1D_ARRAY ||
				  m_iteration_parent_texture_target == GL_TEXTURE_2D_ARRAY ||
				  m_iteration_parent_texture_target == GL_TEXTURE_2D_MULTISAMPLE ||
				  m_iteration_parent_texture_target == GL_TEXTURE_2D_MULTISAMPLE_ARRAY ||
				  m_iteration_parent_texture_target == GL_TEXTURE_CUBE_MAP_ARRAY);

		DE_ASSERT(m_iteration_parent_texture_depth >= 1);
		DE_ASSERT(m_iteration_parent_texture_n_levels >= 1);

		const unsigned int n_faces =
			(m_iteration_parent_texture_target == GL_TEXTURE_CUBE_MAP_ARRAY) ? 6 /* faces */ : 1;

		resetReferenceColorStorage(m_iteration_parent_texture_depth,			 /* n_layers */
								   n_faces, m_iteration_parent_texture_n_levels, /* n_mipmaps */
								   m_max_color_texture_samples_gl_value);		 /* n_samples */

		/* Set up storage for reference colors the fragment shader should use
		 * when rendering to multisampled texture target */
		float* reference_colors = new float[4 /* rgba */ * m_max_color_texture_samples_gl_value];

		/* Activate the filler program */
		gl.useProgram(m_per_sample_filler_po_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() call failed.");

		/* Iterate through all layers of the texture. */
		for (unsigned int n_layer = 0; n_layer < m_iteration_parent_texture_depth; ++n_layer)
		{
			/* ..faces.. */
			for (unsigned int n_face = 0; n_face < n_faces; ++n_face)
			{
				/* ..and mip-maps, too. */
				for (unsigned int n_mipmap = 0; n_mipmap < m_iteration_parent_texture_n_levels; ++n_mipmap)
				{
					/* For all texture targets considered excl. GL_TEXTURE_2D_MULTISAMPLE, we need
					 * to use glFramebufferTextur() to bind all layers to the color atatchment. For
					 * 2DMS textures, we can use plain glFramebufferTexture2D().
					 */
					if (m_iteration_parent_texture_target != GL_TEXTURE_2D_MULTISAMPLE)
					{
						gl.framebufferTexture(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, m_to_id, n_mipmap);

						GLU_EXPECT_NO_ERROR(gl.getError(), "glFramebufferTextureLayer() call failed.");
					}
					else
					{
						/* Sanity check */
						DE_ASSERT(m_iteration_parent_texture_depth == 1);

						gl.framebufferTexture2D(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0,
												m_iteration_parent_texture_target, m_to_id, n_mipmap);

						GLU_EXPECT_NO_ERROR(gl.getError(), "glFramebufferTexture2D() call failed.");
					}

					/* Generate reference colors for all samples */
					const unsigned int n_samples =
						(is_multisampled_texture_target) ? m_max_color_texture_samples_gl_value : 1;

					for (unsigned int n_sample = 0; n_sample < n_samples; ++n_sample)
					{
						tcu::Vec4 reference_color = getRandomReferenceColor();

						reference_colors[4 /* rgba */ * n_sample + 0] = reference_color.x();
						reference_colors[4 /* rgba */ * n_sample + 1] = reference_color.y();
						reference_colors[4 /* rgba */ * n_sample + 2] = reference_color.z();
						reference_colors[4 /* rgba */ * n_sample + 3] = reference_color.w();

						setReferenceColor(n_layer, n_face, n_mipmap, n_sample, reference_color);
					} /* for (all samples) */

					/* Upload the reference sample colors */
					gl.uniform4fv(m_per_sample_filler_po_reference_colors_location, n_samples, reference_colors);
					GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform4fv() call failed.");

					/* Update the layer ID the program should render to */
					const unsigned int layer_id = n_face * 6 /* faces */ + n_layer;

					gl.uniform1i(m_per_sample_filler_po_layer_id_location, layer_id);
					GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform1i() call failed.");

					/* Draw the full-screen quad. Geometry shader will draw the quad for us,
					 * so all we need to do is to feed the rendering pipeline with a single
					 * point.
					 */
					gl.drawArrays(GL_POINTS, 0 /* first */, 1 /* count */);
					GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays() call failed.");
				} /* for (all mip-maps) */
			}	 /* for (all faces) */
		}		  /* for (all layers) */

		delete[] reference_colors;
	}
}